

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterHyperCoDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  type_conflict5 tVar1;
  char *pcVar2;
  int *piVar3;
  cpp_dec_float<50U,_int,_void> *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar4;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 in_RSI;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  int i_1;
  int i;
  int idx;
  int enterIdx;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  leastBest;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pen;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *test;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb8c;
  undefined4 in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffba4;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffba8;
  undefined1 local_428 [56];
  undefined1 local_3f0 [8];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc28;
  undefined1 local_3b8 [56];
  undefined1 local_380 [56];
  uint local_348;
  undefined4 local_344;
  undefined1 local_340 [56];
  undefined1 local_308 [56];
  undefined1 local_2d0 [56];
  undefined1 local_298 [56];
  undefined1 local_260 [56];
  uint local_228;
  int local_224;
  int local_220;
  undefined1 local_21c [56];
  undefined4 local_1e4;
  undefined1 local_1e0 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a0;
  undefined8 local_190;
  DataKey local_180;
  undefined8 local_178;
  undefined4 *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  undefined1 *local_140;
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  undefined1 *local_110;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  fpclass_type *local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  fpclass_type *local_90;
  undefined1 *local_88;
  undefined8 local_80;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined4 *local_68;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_59;
  cpp_dec_float<50U,_int,_void> *local_58;
  undefined1 *local_50;
  cpp_dec_float<50U,_int,_void> *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  cpp_dec_float<50U,_int,_void> *local_28;
  undefined1 *local_20;
  cpp_dec_float<50U,_int,_void> *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_190 = in_RSI;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::test(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           **)((in_RDI->m_backend).data._M_elems + 4));
  local_1a0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x3b0c72);
  local_1a8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::get_const_ptr((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x3b0c92);
  local_1e4 = 0xffffffff;
  local_168 = local_1e0;
  local_170 = &local_1e4;
  local_178 = 0;
  local_68 = local_170;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            ((cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),(longlong)in_RDI,in_RDX);
  local_160 = local_21c;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(in_RDX);
  local_220 = -1;
  local_228 = IdxSet::size((IdxSet *)(in_RDI[4].m_backend.data._M_elems + 4));
  uVar4 = extraout_RDX;
  while (local_228 = local_228 - 1, -1 < (int)local_228) {
    pcVar2 = IdxSet::index((IdxSet *)(in_RDI[4].m_backend.data._M_elems + 4),
                           (char *)(ulong)local_228,(int)uVar4);
    local_224 = (int)pcVar2;
    local_78 = local_1a0 + local_224;
    local_70 = local_21c;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                      CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    local_20 = local_260;
    local_28 = in_RDX;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_29,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)in_RDX);
    local_10 = local_260;
    local_18 = local_28;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                      CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    local_8 = local_260;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate(in_RDX);
    tVar1 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x3b0e4a);
    if (tVar1) {
      local_150 = local_2d0;
      local_158 = local_21c;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      local_148 = local_1a8 + local_224;
      local_140 = local_308;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      local_130 = local_340;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      devexpr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      local_e0 = local_21c;
      local_e8 = local_298;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      tVar1 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3b0f6d);
      if (tVar1) {
        local_80 = local_190;
        local_88 = local_21c;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                          CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        local_220 = local_224;
        local_98 = local_1a8 + local_224;
        local_90 = &in_RDI[1].m_backend.fpclass;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                          CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      }
      tVar1 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3b1013);
      in_stack_fffffffffffffb8c = CONCAT13(1,(int3)in_stack_fffffffffffffb8c);
      uVar4 = extraout_RDX_00;
      if (!tVar1) {
        local_344 = 0;
        tVar1 = boost::multiprecision::operator<(in_RDI,(int *)in_RDX);
        in_stack_fffffffffffffb8c = CONCAT13(tVar1,(int3)in_stack_fffffffffffffb8c);
        uVar4 = extraout_RDX_01;
      }
      if ((char)((uint)in_stack_fffffffffffffb8c >> 0x18) != '\0') {
        local_a0 = local_1e0;
        local_a8 = local_21c;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                          CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        uVar4 = extraout_RDX_02;
      }
    }
    else {
      IdxSet::remove((IdxSet *)(in_RDI[4].m_backend.data._M_elems + 4),(char *)(ulong)local_228);
      piVar3 = DataArray<int>::operator[]
                         ((DataArray<int> *)
                          (*(long *)((in_RDI->m_backend).data._M_elems + 4) + 0xd10),local_224);
      *piVar3 = 0;
      uVar4 = extraout_RDX_03;
    }
  }
  local_348 = IdxSet::size((IdxSet *)(*(long *)((in_RDI->m_backend).data._M_elems + 4) + 0xcd8));
  uVar4 = extraout_RDX_04;
  while (local_348 = local_348 - 1, -1 < (int)local_348) {
    pcVar2 = IdxSet::index((IdxSet *)(*(long *)((in_RDI->m_backend).data._M_elems + 4) + 0xcd8),
                           (char *)(ulong)local_348,(int)uVar4);
    local_224 = (int)pcVar2;
    piVar3 = DataArray<int>::operator[]
                       ((DataArray<int> *)(*(long *)((in_RDI->m_backend).data._M_elems + 4) + 0xd10)
                        ,local_224);
    uVar4 = extraout_RDX_05;
    if (*piVar3 == 1) {
      local_b8 = local_1a0 + local_224;
      local_b0 = local_21c;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      local_50 = local_380;
      local_58 = in_RDX;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_59,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_RDX);
      local_40 = local_380;
      local_48 = local_58;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                        CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      local_38 = local_380;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate(in_RDX);
      tVar1 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3b122b);
      if (tVar1) {
        local_120 = local_3f0;
        local_128 = local_21c;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                          CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        local_118 = local_1a8 + local_224;
        local_110 = local_428;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                          CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        local_100 = &stack0xfffffffffffffba0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                          CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
        local_f0 = local_21c;
        local_f8 = local_3b8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                          CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        tVar1 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x3b1342);
        uVar4 = extraout_RDX_06;
        if (tVar1) {
          tVar1 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x3b1360);
          if (tVar1) {
            local_c0 = local_190;
            local_c8 = local_21c;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                              CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
            local_220 = local_224;
            local_d8 = local_1a8 + local_224;
            local_d0 = &in_RDI[1].m_backend.fpclass;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      (in_RDX,(cpp_dec_float<50U,_int,_void> *)
                              CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
          }
          piVar3 = DataArray<int>::operator[]
                             ((DataArray<int> *)
                              (*(long *)((in_RDI->m_backend).data._M_elems + 4) + 0xd10),local_224);
          *piVar3 = 2;
          DIdxSet::addIdx((DIdxSet *)in_RDX,in_stack_fffffffffffffb8c);
          uVar4 = extraout_RDX_07;
        }
      }
      else {
        piVar3 = DataArray<int>::operator[]
                           ((DataArray<int> *)
                            (*(long *)((in_RDI->m_backend).data._M_elems + 4) + 0xd10),local_224);
        *piVar3 = 0;
        uVar4 = extraout_RDX_08;
      }
    }
  }
  if (local_220 < 0) {
    SPxId::SPxId((SPxId *)0x3b149f);
  }
  else {
    local_180 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::id(in_stack_fffffffffffffba8,in_stack_fffffffffffffba4);
  }
  return (SPxId)local_180;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterHyperCoDim(R& best, R feastol)
{
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   R leastBest = -1;
   R x;
   int enterIdx = -1;
   int idx;

   // find the best price from short candidate list
   for(int i = bestPricesCo.size() - 1; i >= 0; --i)
   {
      idx = bestPricesCo.index(i);
      x = test[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, pen[idx], feastol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = pen[idx];
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPricesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   //scan the updated indeces for a better price
   for(int i = this->thesolver->updateViolsCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViolsCo.index(i);

      // only look at indeces that were not checked already
      if(this->thesolver->isInfeasibleCo[idx] == this->VIOLATED)
      {
         x = test[idx];

         if(x < -feastol)
         {
            x = devexpr::computePrice(x, pen[idx], feastol);

            if(x > leastBest)
            {
               if(x > best)
               {
                  best = x;
                  enterIdx = idx;
                  last = pen[idx];
               }

               // put index into candidate list
               this->thesolver->isInfeasibleCo[idx] = this->VIOLATED_AND_CHECKED;
               bestPricesCo.addIdx(idx);
            }
         }
         else
         {
            this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);
   else
      return SPxId();
}